

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_deserialize(void *buf)

{
  uint uVar1;
  roaring_bitmap_t *prVar2;
  
  if (*buf != '\x02') {
    if (*buf == '\x01') {
      uVar1 = *(uint *)((long)buf + 1);
      prVar2 = roaring_bitmap_create_with_capacity(0);
      roaring_bitmap_add_many(prVar2,(ulong)uVar1,(uint32_t *)((long)buf + 5));
    }
    else {
      prVar2 = (roaring_bitmap_t *)0x0;
    }
    return prVar2;
  }
  prVar2 = roaring_bitmap_portable_deserialize_safe((char *)((long)buf + 1),0xffffffffffffffff);
  return prVar2;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize(const void *buf) {
    const char *bufaschar = (const char *)buf;
    if (*(const unsigned char *)buf == SERIALIZATION_ARRAY_UINT32) {
        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;
        memcpy(&card, bufaschar + 1, sizeof(uint32_t));
        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        return roaring_bitmap_of_ptr(card, elems);
    } else if (bufaschar[0] == SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize(bufaschar + 1);
    } else
        return (NULL);
}